

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

int currencyNameComparator(void *a,void *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  CurrencyNameStruct *currName_2;
  CurrencyNameStruct *currName_1;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ushort uVar8;
  bool bVar9;
  
  uVar1 = *(uint *)((long)a + 0x10);
  uVar2 = *(uint *)((long)b + 0x10);
  uVar3 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar3 = uVar1;
  }
  uVar5 = 0xffffffff;
  bVar9 = 0 < (int)uVar3;
  uVar6 = 0xffffffff;
  if (0 < (int)uVar3) {
    uVar8 = **(ushort **)((long)a + 8);
    uVar4 = **(ushort **)((long)b + 8);
    uVar6 = uVar5;
    if (uVar4 <= uVar8) {
      uVar7 = 1;
      do {
        if (uVar4 < uVar8) {
          uVar6 = 1;
          break;
        }
        bVar9 = uVar7 < uVar3;
        if (uVar7 == uVar3) break;
        uVar8 = (*(ushort **)((long)a + 8))[uVar7];
        uVar4 = (*(ushort **)((long)b + 8))[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 <= uVar8);
    }
  }
  uVar3 = (uint)((int)uVar2 < (int)uVar1);
  if (bVar9) {
    uVar3 = uVar6;
  }
  if ((int)uVar1 < (int)uVar2) {
    uVar3 = uVar6;
  }
  return uVar3;
}

Assistant:

static int U_CALLCONV currencyNameComparator(const void* a, const void* b) {
    const CurrencyNameStruct* currName_1 = (const CurrencyNameStruct*)a;
    const CurrencyNameStruct* currName_2 = (const CurrencyNameStruct*)b;
    for (int32_t i = 0; 
         i < MIN(currName_1->currencyNameLen, currName_2->currencyNameLen);
         ++i) {
        if (currName_1->currencyName[i] < currName_2->currencyName[i]) {
            return -1;
        }
        if (currName_1->currencyName[i] > currName_2->currencyName[i]) {
            return 1;
        }
    }
    if (currName_1->currencyNameLen < currName_2->currencyNameLen) {
        return -1;
    } else if (currName_1->currencyNameLen > currName_2->currencyNameLen) {
        return 1;
    }
    return 0;
}